

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_test_util.h
# Opt level: O0

char * compare_histograms(hdr_histogram *expected,hdr_histogram *actual)

{
  _Bool _Var1;
  undefined1 local_120 [8];
  hdr_iter actual_iter;
  hdr_iter expected_iter;
  hdr_histogram *actual_local;
  hdr_histogram *expected_local;
  
  hdr_iter_init((hdr_iter *)&actual_iter._next_fp,expected);
  hdr_iter_init((hdr_iter *)local_120,actual);
  do {
    _Var1 = hdr_iter_next((hdr_iter *)&actual_iter._next_fp);
    if (!_Var1) {
      _Var1 = compare_int64(expected->min_value,actual->min_value);
      if (!_Var1) {
        expected_local = (hdr_histogram *)anon_var_dwarf_d4;
        return (char *)expected_local;
      }
      _Var1 = compare_int64(expected->max_value,actual->max_value);
      if (!_Var1) {
        expected_local = (hdr_histogram *)anon_var_dwarf_ea;
        return (char *)expected_local;
      }
      _Var1 = compare_int64(expected->total_count,actual->total_count);
      if (!_Var1) {
        expected_local = (hdr_histogram *)anon_var_dwarf_f4;
        return (char *)expected_local;
      }
      return (char *)0x0;
    }
    _Var1 = hdr_iter_next((hdr_iter *)local_120);
    if (!_Var1) {
      expected_local = (hdr_histogram *)anon_var_dwarf_a8;
      return (char *)expected_local;
    }
    _Var1 = compare_int64(expected_iter.total_count,actual_iter.total_count);
  } while (_Var1);
  expected_local = (hdr_histogram *)anon_var_dwarf_be;
  return (char *)expected_local;
}

Assistant:

static char* compare_histograms(struct hdr_histogram* expected, struct hdr_histogram* actual)
{
    struct hdr_iter expected_iter;
    struct hdr_iter actual_iter;

    hdr_iter_init(&expected_iter, expected);
    hdr_iter_init(&actual_iter, actual);

    while (hdr_iter_next(&expected_iter))
    {
        mu_assert("Should have next", hdr_iter_next(&actual_iter));
        mu_assert("counts mismatch", compare_int64(expected_iter.count, actual_iter.count));
    }

    mu_assert("Min mismatch", compare_int64(expected->min_value, actual->min_value));
    mu_assert("Max mismatch", compare_int64(expected->max_value, actual->max_value));
    mu_assert("Total mismatch", compare_int64(expected->total_count, actual->total_count));

    return 0;
}